

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_store_fpr_Q(DisasContext_conflict8 *dc,uint dst,TCGv_i32 v1,TCGv_i32 v2)

{
  TCGContext_conflict8 *tcg_ctx_00;
  uint rd;
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i32 v2_local;
  TCGv_i32 v1_local;
  uint dst_local;
  DisasContext_conflict8 *dc_local;
  
  tcg_ctx_00 = dc->uc->tcg_ctx;
  rd = (dst & 1) << 5 | dst & 0x1c;
  tcg_gen_mov_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_fpr[rd >> 1],v1);
  tcg_gen_mov_i64_sparc64(tcg_ctx_00,(TCGv_i32)tcg_ctx_00->cpu_fpr[(rd >> 1) + 1],v2);
  gen_update_fprs_dirty(dc,rd);
  return;
}

Assistant:

static void gen_store_fpr_Q(DisasContext *dc, unsigned int dst,
                            TCGv_i64 v1, TCGv_i64 v2)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    dst = QFPREG(dst);

    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2], v1);
    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2 + 1], v2);
    gen_update_fprs_dirty(dc, dst);
}